

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Opnd * __thiscall
GlobOpt::CopyProp(GlobOpt *this,Opnd *opnd,Instr *instr,Value *val,IndirOpnd *parentIndirOpnd)

{
  IRType type;
  OpCode OVar1;
  int iVar2;
  IndirOpnd *this_00;
  Opnd *this_01;
  code *pcVar3;
  Sym *this_02;
  GlobOpt *pGVar4;
  OpndKind OVar5;
  bool bVar6;
  OpndKind OVar7;
  uint uVar8;
  uint uVar9;
  JITTimeFunctionBody *pJVar10;
  FunctionJITTimeInfo *pFVar11;
  IndirOpnd *pIVar12;
  Int64ConstOpnd *this_03;
  AddrOpnd *this_04;
  StackSym *pSVar13;
  int64 iVar14;
  Opnd *pOVar15;
  RegOpnd *pRVar16;
  undefined4 *puVar17;
  SymOpnd *pSVar18;
  StackSym *pSVar19;
  uint uVar20;
  ulong value;
  int i;
  long lVar21;
  Instr *pIVar22;
  Opnd *local_78;
  int64 int64ConstantValue;
  Opnd *local_68;
  Sym *local_58;
  IndirOpnd *local_50;
  Instr *local_48;
  uint local_3c;
  GlobOpt *pGStack_38;
  int32 intConstantValue;
  
  pGStack_38 = this;
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    if (((instr->m_src1 != opnd) && (instr->m_src2 != opnd)) &&
       ((instr->m_dst != opnd || (OVar5 = IR::Opnd::GetKind(opnd), OVar5 != OpndKindIndir))))
    goto LAB_0045675b;
  }
  else if ((parentIndirOpnd->m_baseOpnd != (RegOpnd *)opnd) &&
          (parentIndirOpnd->m_indexOpnd != (RegOpnd *)opnd)) {
LAB_0045675b:
    AssertCount = AssertCount + 1;
    local_50 = parentIndirOpnd;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xe8d,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar6) goto LAB_00457551;
    *puVar17 = 0;
    parentIndirOpnd = local_50;
  }
  if (pGStack_38->prePassLoop != (Loop *)0x0) {
    return opnd;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == CheckFixedFld) {
    return opnd;
  }
  if (OVar1 == CheckPropertyGuardAndLoadType) {
    return opnd;
  }
  if ((OVar1 == ExtendArg_A) && (instr->m_src2 == opnd)) {
    return opnd;
  }
  if (((((ushort)(OVar1 - Simd128_IntsToI4) < 0x14 || (ushort)(OVar1 - Simd128_BitSelect_I4) < 0x123
        ) && (instr->m_src1 != (Opnd *)0x0)) &&
      (OVar5 = IR::Opnd::GetKind(instr->m_src1), OVar5 == OpndKindReg)) &&
     (((instr->m_src2 == (Opnd *)0x0 &&
       (pSVar19 = IR::Opnd::GetStackSym(instr->m_src1), pSVar19 != (StackSym *)0x0)) &&
      ((((pSVar19->field_5).m_instrDef != (Instr *)0x0 & pSVar19->field_0x18) == 1 &&
       (((pSVar19->field_5).m_instrDef)->m_opcode == ExtendArg_A)))))) {
    return opnd;
  }
  pIVar12 = (IndirOpnd *)val->valueInfo;
  bVar6 = Func::HasFinally(pGStack_38->func);
  if (((bVar6) && (instr->m_opcode == ArgOut_A_Inline)) &&
     ((pIVar12->m_baseOpnd != (RegOpnd *)0x0 && (*(SymID *)&pIVar12->m_baseOpnd->m_sym == 0)))) {
    return opnd;
  }
  bVar6 = ValueInfo::TryGetIntConstantValue((ValueInfo *)pIVar12,(int32 *)&local_3c,false);
  pGVar4 = pGStack_38;
  local_48 = instr;
  if (!bVar6) {
    local_50 = pIVar12;
    bVar6 = ValueInfo::TryGetIntConstantValue((ValueInfo *)pIVar12,(int64 *)&local_78,false);
    pGVar4 = pGStack_38;
    if (bVar6) {
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ConstPropPhase,uVar8,uVar9);
      pGVar4 = pGStack_38;
      if (bVar6) {
        return opnd;
      }
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
      uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015c1bd0,Int64ConstPropPhase,uVar8,uVar9);
      if (!bVar6) {
        return opnd;
      }
      pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
      bVar6 = JITTimeFunctionBody::IsWasmFunction(pJVar10);
      if (bVar6) {
LAB_00456cfd:
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
        bVar6 = JITTimeFunctionBody::IsWasmFunction(pJVar10);
        if (!bVar6) {
          return opnd;
        }
        bVar6 = IRType_IsInt64(opnd->m_type);
        pIVar22 = local_48;
        if (!bVar6) {
          return opnd;
        }
        this_03 = IR::Int64ConstOpnd::New((int64)local_78,opnd->m_type,local_48->m_func);
        pGVar4 = pGStack_38;
        pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
        uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
        pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
        uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar8,uVar9);
        if (bVar6) {
          Output::Print(L"TRACE ");
          if (pGStack_38->prePassLoop != (Loop *)0x0) {
            Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                          (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          IR::Opnd::Dump(opnd);
          Output::Print(L" : ");
          iVar14 = IR::Opnd::GetImmediateValue(&this_03->super_Opnd,pIVar22->m_func);
          Output::Print(L"Constant prop %lld (value:%lld)\n",iVar14,local_78);
          Output::Flush();
        }
        CaptureByteCodeSymUses(pGStack_38,pIVar22);
        pOVar15 = IR::Instr::ReplaceSrc(pIVar22,opnd,&this_03->super_Opnd);
        return pOVar15;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar17 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xf69,"(this->func->GetJITFunctionBody()->IsWasmFunction())",
                         "this->func->GetJITFunctionBody()->IsWasmFunction()");
      if (bVar6) {
        *puVar17 = 0;
        goto LAB_00456cfd;
      }
      goto LAB_00457551;
    }
    OVar5 = IR::Opnd::GetKind(opnd);
    OVar7 = IR::Opnd::GetKind(opnd);
    if (OVar5 == OpndKindReg) {
      pSVar18 = (SymOpnd *)opnd;
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar6) goto LAB_00457551;
        *puVar17 = 0;
      }
LAB_00456ff8:
      local_58 = pSVar18->m_sym;
    }
    else {
      if (OVar7 == OpndKindSym) {
        pSVar18 = IR::Opnd::AsSymOpnd(opnd);
        goto LAB_00456ff8;
      }
      local_58 = (Sym *)0x0;
    }
    pGVar4 = pGStack_38;
    if (local_58 == (Sym *)0x0) {
      return opnd;
    }
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,CopyPropPhase,uVar8,uVar9);
    this_02 = local_58;
    if (bVar6) {
LAB_00457461:
      SetSymStoreDirect(pGStack_38,(ValueInfo *)local_50,this_02);
      return opnd;
    }
    pSVar19 = GlobOptBlockData::GetCopyPropSym(&pGStack_38->currentBlock->globOptData,local_58,val);
    pIVar22 = local_48;
    if (pSVar19 == (StackSym *)0x0) {
      if ((((local_50->m_baseOpnd != (RegOpnd *)0x0) && (local_48->m_opcode == Ld_A)) &&
          (OVar5 = IR::Opnd::GetKind(local_48->m_dst), OVar5 == OpndKindReg)) &&
         (pSVar19 = (StackSym *)local_50->m_baseOpnd, pRVar16 = IR::Opnd::AsRegOpnd(pIVar22->m_dst),
         pSVar19 == pRVar16->m_sym)) {
        return opnd;
      }
      goto LAB_00457461;
    }
    if ((this_02->m_kind != SymKindStack) ||
       (iVar2 = TySize[pSVar19->m_type], pSVar13 = Sym::AsStackSym(this_02),
       iVar2 == TySize[pSVar13->m_type])) {
LAB_0045715d:
      pOVar15 = CopyPropReplaceOpnd(pGStack_38,local_48,opnd,pSVar19,parentIndirOpnd);
      return pOVar15;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar17 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xf8d,
                       "(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize())"
                       ,
                       "!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize()"
                      );
    if (bVar6) {
      *puVar17 = 0;
      goto LAB_0045715d;
    }
    goto LAB_00457551;
  }
  pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
  uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
  uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,ConstPropPhase,uVar8,uVar9);
  pIVar22 = local_48;
  if (bVar6) {
    return opnd;
  }
  OVar1 = local_48->m_opcode;
  if ((((OVar1 == StElemI_A) || (OVar1 == StElemC)) || (OVar1 == StElemI_A_Strict)) &&
     (local_48->m_src1 == opnd)) {
    pIVar12 = IR::Opnd::AsIndirOpnd(local_48->m_dst);
    local_78 = (Opnd *)CONCAT62(local_78._2_6_,
                                (pIVar12->m_baseOpnd->super_Opnd).m_valueType.field_0.bits);
    bVar6 = ValueType::IsLikelyNativeArray((ValueType *)&local_78);
    if (bVar6) {
      return opnd;
    }
  }
  if ((pIVar22->m_src1 != opnd) && (pIVar22->m_src2 != opnd)) {
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pIVar22->m_func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pIVar22->m_func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,IndirCopyPropPhase,uVar8,uVar9);
    if (bVar6) {
      return opnd;
    }
    local_78 = pIVar22->m_src1;
    int64ConstantValue = (int64)pIVar22->m_src2;
    local_68 = pIVar22->m_dst;
    pIVar12 = (IndirOpnd *)__tls_get_addr(&PTR_0155fe48);
    local_58 = (Sym *)&DAT_015cd718;
    lVar21 = 0;
    local_50 = pIVar12;
    do {
      this_00 = (IndirOpnd *)(&local_78)[lVar21];
      if ((this_00 != (IndirOpnd *)0x0) &&
         (OVar5 = IR::Opnd::GetKind((Opnd *)this_00), OVar5 == OpndKindIndir)) {
        OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
        if (OVar5 != OpndKindIndir) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)&(pIVar12->super_Opnd)._vptr_Opnd = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (!bVar6) goto LAB_00457551;
          *(undefined4 *)&(pIVar12->super_Opnd)._vptr_Opnd = 0;
        }
        if (((long)(int)local_3c + (long)this_00->m_offset < 0x80000000) &&
           (this_00->m_indexOpnd == (RegOpnd *)opnd)) {
          if (this_00->m_scale != '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&(pIVar12->super_Opnd)._vptr_Opnd = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xeed,"(indir->GetScale() == 0)","indir->GetScale() == 0");
            if (!bVar6) goto LAB_00457551;
            *(undefined4 *)&(pIVar12->super_Opnd)._vptr_Opnd = 0;
          }
          pGVar4 = pGStack_38;
          pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
          uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
          pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
          uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
          bVar6 = Js::Phases::IsEnabled((Phases *)local_58,GlobOptPhase,uVar8,uVar9);
          pIVar22 = local_48;
          if (bVar6) {
            Output::Print(L"TRACE ");
            if (pGStack_38->prePassLoop != (Loop *)0x0) {
              Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                            (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            IR::Opnd::Dump(opnd);
            Output::Print(L" : ");
            Output::Print(L"Constant prop indir index into offset (value: %d)\n",(ulong)local_3c);
            Output::Flush();
          }
          CaptureByteCodeSymUses(pGStack_38,pIVar22);
          this_00->m_offset = this_00->m_offset + local_3c;
          (this_00->super_Opnd).field_0xe = 0;
          IR::IndirOpnd::SetIndexOpnd(this_00,(RegOpnd *)0x0);
          pIVar12 = local_50;
        }
      }
      lVar21 = lVar21 + 1;
      if (lVar21 == 3) {
        return opnd;
      }
    } while( true );
  }
  type = opnd->m_type;
  if (type == TyInt32) {
LAB_004571e6:
    bVar6 = opnd->m_type == TyUint32;
    value = (ulong)local_3c;
    if (!bVar6) {
      value = (long)(int)local_3c;
    }
    this_04 = (AddrOpnd *)
              IR::IntConstOpnd::New(value,bVar6 * '\x04' + TyInt32,pIVar22->m_func,false);
    pGVar4 = pGStack_38;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar8,uVar9);
    pIVar22 = local_48;
    if (bVar6) {
      Output::Print(L"TRACE ");
      if (pGStack_38->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                      (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump(opnd);
      Output::Print(L" : ");
      pIVar22 = local_48;
      iVar14 = IR::Opnd::GetImmediateValue((Opnd *)this_04,local_48->m_func);
      Output::Print(L"Constant prop %d (value:%d)\n",iVar14,(ulong)local_3c);
LAB_004572f1:
      Output::Flush();
    }
  }
  else {
    if (type != TyVar) {
      bVar6 = IRType_IsInt64(type);
      if ((!bVar6) && (opnd->m_type != TyUint32)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar17 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xf09,"(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32())",
                           "opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32()");
        if (!bVar6) goto LAB_00457551;
        *puVar17 = 0;
        pIVar22 = local_48;
      }
      goto LAB_004571e6;
    }
    this_04 = IR::AddrOpnd::New((Var)((ulong)local_3c | 0x1000000000000),AddrOpndKindConstantVar,
                                pIVar22->m_func,false,(Var)0x0);
    pGVar4 = pGStack_38;
    pJVar10 = JITTimeWorkItem::GetJITFunctionBody(pGStack_38->func->m_workItem);
    uVar8 = JITTimeFunctionBody::GetSourceContextId(pJVar10);
    pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pGVar4->func->m_workItem);
    uVar9 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar11);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar8,uVar9);
    pIVar22 = local_48;
    if (bVar6) {
      Output::Print(L"TRACE ");
      if (pGStack_38->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(pGStack_38->rootLoopPrePass->loopNumber - 1),
                      (ulong)(pGStack_38->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      IR::Opnd::Dump(opnd);
      Output::Print(L" : ");
      Output::Print(L"Constant prop %d (value:%d)\n",this_04->m_address,(ulong)local_3c);
      pIVar22 = local_48;
      goto LAB_004572f1;
    }
  }
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,FieldCopyPropPhase);
  if (bVar6) {
    IR::Instr::DumpFieldCopyPropTestTrace
              (pIVar22,SUB41((*(uint *)&pGStack_38->field_0xf4 & 0x20) >> 5,0));
  }
  CaptureByteCodeSymUses(pGStack_38,pIVar22);
  pOVar15 = IR::Instr::ReplaceSrc(pIVar22,opnd,&this_04->super_Opnd);
  OVar1 = pIVar22->m_opcode;
  if (OVar1 < LdRootFldForTypeOf) {
    uVar20 = OVar1 - 0x59;
    if (uVar20 < 0x34) {
      if ((0x81800002aa020U >> ((ulong)uVar20 & 0x3f) & 1) != 0) goto LAB_00457377;
      if ((ulong)uVar20 == 0) goto LAB_0045748f;
    }
    if (OVar1 == TypeofElem) {
      pIVar22->m_opcode = Typeof;
      return pOVar15;
    }
    if (OVar1 != Ld_A) {
      return pOVar15;
    }
  }
  else {
    uVar20 = OVar1 - 0x1ed;
    if (uVar20 < 0xc) {
      if ((0x23U >> (uVar20 & 0x1f) & 1) != 0) {
LAB_0045748f:
        OVar5 = IR::Opnd::GetKind(pIVar22->m_dst);
        if (OVar5 == OpndKindReg) {
          pRVar16 = IR::Opnd::AsRegOpnd(pIVar22->m_dst);
          if ((pRVar16->m_sym->field_0x18 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar17 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar17 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0xf48,"(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef)",
                               "instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef");
            if (!bVar6) {
LAB_00457551:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar17 = 0;
            pIVar22 = local_48;
          }
          pSVar18 = (SymOpnd *)IR::Opnd::AsRegOpnd(pIVar22->m_dst);
        }
        else {
          pSVar18 = IR::Opnd::AsSymOpnd(pIVar22->m_dst);
        }
        pSVar19 = Sym::AsStackSym((Sym *)pSVar18->m_sym);
        goto LAB_0045753b;
      }
      if ((0x300U >> (uVar20 & 0x1f) & 1) != 0) goto LAB_00457377;
      if (uVar20 == 0xb) {
        if (pIVar22->m_src2 != pOVar15) {
          return pOVar15;
        }
        pIVar22->m_opcode = StSlot;
        IR::Instr::FreeSrc2(pIVar22);
        return (Opnd *)0x0;
      }
    }
    if ((OVar1 != ScopedLdFldForTypeOf) && (OVar1 != LdRootFldForTypeOf)) {
      return pOVar15;
    }
LAB_00457377:
    pIVar22->m_opcode = Ld_A;
  }
  this_01 = pIVar22->m_dst;
  OVar5 = IR::Opnd::GetKind(this_01);
  if (OVar5 != OpndKindReg) {
    return pOVar15;
  }
  pRVar16 = IR::Opnd::AsRegOpnd(this_01);
  if ((pRVar16->m_sym->field_0x18 & 1) == 0) {
    return pOVar15;
  }
  if ((pRVar16->m_sym->field_5).m_instrDef == (Instr *)0x0) {
    return pOVar15;
  }
  pRVar16 = IR::Opnd::AsRegOpnd(this_01);
  pSVar19 = pRVar16->m_sym;
LAB_0045753b:
  StackSym::SetIsIntConst(pSVar19,(long)(int)local_3c);
  return pOVar15;
}

Assistant:

IR::Opnd *
GlobOpt::CopyProp(IR::Opnd *opnd, IR::Instr *instr, Value *val, IR::IndirOpnd *parentIndirOpnd)
{
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    if (this->IsLoopPrePass())
    {
        // Transformations are not legal in prepass...
        return opnd;
    }

    if (instr->m_opcode == Js::OpCode::CheckFixedFld || instr->m_opcode == Js::OpCode::CheckPropertyGuardAndLoadType)
    {
        // Don't copy prop into CheckFixedFld or CheckPropertyGuardAndLoadType
        return opnd;
    }

    // Don't copy-prop link operands of ExtendedArgs
    if (instr->m_opcode == Js::OpCode::ExtendArg_A && opnd == instr->GetSrc2())
    {
        return opnd;
    }

    // Don't copy-prop operand of SIMD instr with ExtendedArg operands. Each instr should have its exclusive EA sequence.
    if (
            Js::IsSimd128Opcode(instr->m_opcode) &&
            instr->GetSrc1() != nullptr &&
            instr->GetSrc1()->IsRegOpnd() &&
            instr->GetSrc2() == nullptr
       )
    {
        StackSym *sym = instr->GetSrc1()->GetStackSym();
        if (sym && sym->IsSingleDef() && sym->GetInstrDef()->m_opcode == Js::OpCode::ExtendArg_A)
        {
                return opnd;
        }
    }

    ValueInfo *valueInfo = val->GetValueInfo();

    if (this->func->HasFinally())
    {
        // s0 = undefined was added on functions with early exit in try-finally functions, that can get copy-proped and case incorrect results
        if (instr->m_opcode == Js::OpCode::ArgOut_A_Inline && valueInfo->GetSymStore() &&
            valueInfo->GetSymStore()->m_id == 0)
        {
            // We don't want to copy-prop s0 (return symbol) into inlinee code
            return opnd;
        }
    }

    // Constant prop?
    int32 intConstantValue;
    int64 int64ConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func))
        {
            return opnd;
        }

        if ((
                instr->m_opcode == Js::OpCode::StElemI_A ||
                instr->m_opcode == Js::OpCode::StElemI_A_Strict ||
                instr->m_opcode == Js::OpCode::StElemC
            ) && instr->GetSrc1() == opnd)
        {
            // Disabling prop to src of native array store, because we were losing the chance to type specialize.
            // Is it possible to type specialize this src if we allow constants, etc., to be prop'd here?
            if (instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray())
            {
                return opnd;
            }
        }

        if(opnd != instr->GetSrc1() && opnd != instr->GetSrc2())
        {
            if(PHASE_OFF(Js::IndirCopyPropPhase, instr->m_func))
            {
                return opnd;
            }

            // Const-prop an indir opnd's constant index into its offset
            IR::Opnd *srcs[] = { instr->GetSrc1(), instr->GetSrc2(), instr->GetDst() };
            for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]); ++i)
            {
                const auto src = srcs[i];
                if(!src || !src->IsIndirOpnd())
                {
                    continue;
                }

                const auto indir = src->AsIndirOpnd();
                if ((int64)indir->GetOffset() + intConstantValue > INT32_MAX)
                {
                    continue;
                }
                if(opnd == indir->GetIndexOpnd())
                {
                    Assert(indir->GetScale() == 0);
                    GOPT_TRACE_OPND(opnd, _u("Constant prop indir index into offset (value: %d)\n"), intConstantValue);
                    this->CaptureByteCodeSymUses(instr);
                    indir->SetOffset(indir->GetOffset() + intConstantValue);
                    indir->SetIndexOpnd(nullptr);
                }
            }

            return opnd;
        }

        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return opnd;
        }

        IR::Opnd *constOpnd;

        if (opnd->IsVar())
        {
            IR::AddrOpnd *addrOpnd = IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked((int)intConstantValue), IR::AddrOpndKindConstantVar, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), addrOpnd->m_address, intConstantValue);
            constOpnd = addrOpnd;
        }
        else
        {
            // Note: Jit loop body generates some i32 operands...
            Assert(opnd->IsInt32() || opnd->IsInt64() || opnd->IsUInt32());
            IRType opndType;
            IntConstType constVal;
            if (opnd->IsUInt32())
            {
                // avoid sign extension
                constVal = (uint32)intConstantValue;
                opndType = TyUint32;
            }
            else
            {
                constVal = intConstantValue;
                opndType = TyInt32;
            }
            IR::IntConstOpnd *intOpnd = IR::IntConstOpnd::New(constVal, opndType, instr->m_func);

            GOPT_TRACE_OPND(opnd, _u("Constant prop %d (value:%d)\n"), intOpnd->GetImmediateValue(instr->m_func), intConstantValue);
            constOpnd = intOpnd;
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        //Need to update DumpFieldCopyPropTestTrace for every new opcode that is added for fieldcopyprop
        if(Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FieldCopyPropPhase))
        {
            instr->DumpFieldCopyPropTestTrace(this->isRecursiveCallOnLandingPad);
        }
#endif

        this->CaptureByteCodeSymUses(instr);
        opnd = instr->ReplaceSrc(opnd, constOpnd);

        switch (instr->m_opcode)
        {
        case Js::OpCode::LdSlot:
        case Js::OpCode::LdSlotArr:
        case Js::OpCode::LdFld:
        case Js::OpCode::LdFldForTypeOf:
        case Js::OpCode::LdRootFldForTypeOf:
        case Js::OpCode::LdFldForCallApplyTarget:
        case Js::OpCode::LdRootFld:
        case Js::OpCode::LdMethodFld:
        case Js::OpCode::LdRootMethodFld:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::ScopedLdMethodFld:
        case Js::OpCode::ScopedLdFld:
        case Js::OpCode::ScopedLdFldForTypeOf:
            instr->m_opcode = Js::OpCode::Ld_A;
        case Js::OpCode::Ld_A:
            {
                IR::Opnd * dst = instr->GetDst();
                if (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsSingleDef())
                {
                    dst->AsRegOpnd()->m_sym->SetIsIntConst((int)intConstantValue);
                }
                break;
            }
        case Js::OpCode::ArgOut_A:
        case Js::OpCode::ArgOut_A_Inline:
        case Js::OpCode::ArgOut_A_FixupForStackArgs:
        case Js::OpCode::ArgOut_A_InlineBuiltIn:

            if (instr->GetDst()->IsRegOpnd())
            {
                Assert(instr->GetDst()->AsRegOpnd()->m_sym->m_isSingleDef);
                instr->GetDst()->AsRegOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            else
            {
                instr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->SetIsIntConst((int)intConstantValue);
            }
            break;

        case Js::OpCode::TypeofElem:
            instr->m_opcode = Js::OpCode::Typeof;
            break;

        case Js::OpCode::StSlotChkUndecl:
            if (instr->GetSrc2() == opnd)
            {
                // Src2 here should refer to the same location as the Dst operand, which we need to keep live
                // due to the implicit read for ChkUndecl.
                instr->m_opcode = Js::OpCode::StSlot;
                instr->FreeSrc2();
                opnd = nullptr;
            }
            break;
        }
        return opnd;
    }
    else if (valueInfo->TryGetIntConstantValue(&int64ConstantValue, false))
    {
        if (PHASE_OFF(Js::ConstPropPhase, this->func) || !PHASE_ON(Js::Int64ConstPropPhase, this->func))
        {
            return opnd;
        }

        Assert(this->func->GetJITFunctionBody()->IsWasmFunction());
        if (this->func->GetJITFunctionBody()->IsWasmFunction() && opnd->IsInt64())
        {
            IR::Int64ConstOpnd *intOpnd = IR::Int64ConstOpnd::New(int64ConstantValue, opnd->GetType(), instr->m_func);
            GOPT_TRACE_OPND(opnd, _u("Constant prop %lld (value:%lld)\n"), intOpnd->GetImmediateValue(instr->m_func), int64ConstantValue);
            this->CaptureByteCodeSymUses(instr);
            opnd = instr->ReplaceSrc(opnd, intOpnd);
        }
        return opnd;
    }

    Sym *opndSym = nullptr;
    if (opnd->IsRegOpnd())
    {
        IR::RegOpnd *regOpnd = opnd->AsRegOpnd();
        opndSym = regOpnd->m_sym;
    }
    else if (opnd->IsSymOpnd())
    {
        IR::SymOpnd *symOpnd = opnd->AsSymOpnd();
        opndSym = symOpnd->m_sym;
    }
    if (!opndSym)
    {
        return opnd;
    }

    if (PHASE_OFF(Js::CopyPropPhase, this->func))
    {
        this->SetSymStoreDirect(valueInfo, opndSym);
        return opnd;
    }

    StackSym *copySym = CurrentBlockData()->GetCopyPropSym(opndSym, val);
    if (copySym != nullptr)
    {
        Assert(!opndSym->IsStackSym() || copySym->GetSymSize() == opndSym->AsStackSym()->GetSymSize());
        // Copy prop.
        return CopyPropReplaceOpnd(instr, opnd, copySym, parentIndirOpnd);
    }
    else
    {
        if (valueInfo->GetSymStore() && instr->m_opcode == Js::OpCode::Ld_A && instr->GetDst()->IsRegOpnd()
            && valueInfo->GetSymStore() == instr->GetDst()->AsRegOpnd()->m_sym)
        {
            // Avoid resetting symStore after fieldHoisting:
            //  t1 = LdFld field            <- set symStore to fieldHoistSym
            //   fieldHoistSym = Ld_A t1    <- we're looking at t1 now, but want to copy-prop fieldHoistSym forward
            return opnd;
        }
        this->SetSymStoreDirect(valueInfo, opndSym);
    }
    return opnd;
}